

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminateColSingletons
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Pring *pPVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  Pring *pPVar9;
  Pring *pPVar10;
  int *piVar11;
  int *piVar12;
  Pring *pPVar13;
  pointer pnVar14;
  int *piVar15;
  Pring *pPVar16;
  long lVar17;
  pointer pnVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int *piVar24;
  byte bVar25;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar25 = 0;
  pPVar16 = (this->temp).pivot_colNZ;
  pPVar5 = pPVar16 + 1;
  while( true ) {
    pPVar5 = pPVar5->prev;
    pPVar9 = pPVar16 + 1;
    if (pPVar5 == pPVar9) break;
    iVar1 = pPVar5->idx;
    piVar6 = (this->u).col.len;
    iVar2 = piVar6[iVar1];
    piVar6[iVar1] = iVar2 + -1;
    piVar7 = (this->u).col.idx;
    piVar8 = (this->u).col.start;
    iVar2 = piVar7[(long)piVar8[iVar1] + -1 + (long)iVar2];
    pPVar9 = (this->temp).pivot_row;
    pPVar10 = pPVar9[iVar2].next;
    pPVar9 = pPVar9[iVar2].prev;
    pPVar10->prev = pPVar9;
    pPVar9->next = pPVar10;
    piVar11 = (this->u).row.len;
    iVar20 = piVar11[iVar2] + -1;
    piVar11[iVar2] = iVar20;
    piVar11 = (this->u).row.idx;
    piVar12 = (this->temp).s_cact;
    pPVar9 = (this->temp).pivot_col;
    lVar21 = (long)(iVar20 + (this->u).row.start[iVar2]);
    for (lVar22 = lVar21; iVar20 = piVar11[lVar22], iVar20 != iVar1; lVar22 = lVar22 + -1) {
      iVar3 = piVar8[iVar20];
      iVar4 = piVar6[iVar20];
      iVar23 = piVar12[iVar20];
      piVar12[iVar20] = iVar23 + -1;
      iVar23 = (iVar3 + iVar4) - iVar23;
      piVar15 = piVar7 + iVar23;
      do {
        piVar24 = piVar15;
        piVar15 = piVar24 + 1;
      } while (*piVar24 != iVar2);
      *piVar24 = piVar7[iVar23];
      piVar7[iVar23] = iVar2;
      iVar3 = piVar12[iVar20];
      pPVar10 = pPVar9[iVar20].next;
      pPVar13 = pPVar9[iVar20].prev;
      pPVar10->prev = pPVar13;
      pPVar13->next = pPVar10;
      pPVar10 = pPVar16[iVar3].next;
      pPVar9[iVar20].next = pPVar10;
      pPVar10->prev = pPVar9 + iVar20;
      pPVar9[iVar20].prev = pPVar16 + iVar3;
      pPVar16[iVar3].next = pPVar9 + iVar20;
    }
    iVar20 = (this->temp).stage;
    (this->temp).stage = iVar20 + 1;
    pnVar14 = (this->u).row.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pnVar18 = pnVar14 + lVar22;
    pnVar19 = &local_b0;
    for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar18->m_backend).data._M_elems[0];
      pnVar18 = (pointer)((long)pnVar18 + ((ulong)bVar25 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar25 * -2 + 1) * 4);
    }
    local_b0.m_backend.exp = pnVar14[lVar22].m_backend.exp;
    local_b0.m_backend.neg = pnVar14[lVar22].m_backend.neg;
    local_b0.m_backend.fpclass = pnVar14[lVar22].m_backend.fpclass;
    local_b0.m_backend.prec_elem = pnVar14[lVar22].m_backend.prec_elem;
    setPivot(this,iVar20,iVar1,iVar2,&local_b0);
    piVar6 = (this->u).row.idx;
    piVar6[lVar22] = piVar6[lVar21];
    pnVar14 = (this->u).row.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              (&pnVar14[lVar22].m_backend,&pnVar14[lVar21].m_backend);
    piVar6 = (this->u).row.idx;
    iVar1 = (this->u).row.start[iVar2];
    piVar7 = (this->u).col.len;
    piVar8 = (this->u).col.start;
    piVar11 = (this->temp).s_cact;
    piVar12 = (this->u).col.idx;
    pPVar9 = (this->temp).pivot_col;
    pPVar16 = (this->temp).pivot_colNZ;
    while (iVar1 < lVar22) {
      lVar22 = lVar22 + -1;
      iVar20 = piVar6[lVar22];
      iVar3 = piVar8[iVar20];
      iVar4 = piVar7[iVar20];
      iVar23 = piVar11[iVar20];
      piVar11[iVar20] = iVar23 + -1;
      iVar23 = (iVar3 + iVar4) - iVar23;
      piVar15 = piVar12 + iVar23;
      do {
        piVar24 = piVar15;
        piVar15 = piVar24 + 1;
      } while (*piVar24 != iVar2);
      *piVar24 = piVar12[iVar23];
      piVar12[iVar23] = iVar2;
      iVar3 = piVar11[iVar20];
      pPVar10 = pPVar9[iVar20].next;
      pPVar13 = pPVar9[iVar20].prev;
      pPVar10->prev = pPVar13;
      pPVar13->next = pPVar10;
      pPVar10 = pPVar16[iVar3].next;
      pPVar9[iVar20].next = pPVar10;
      pPVar10->prev = pPVar9 + iVar20;
      pPVar9[iVar20].prev = pPVar16 + iVar3;
      pPVar16[iVar3].next = pPVar9 + iVar20;
    }
  }
  pPVar16[1].next = pPVar9;
  pPVar16[1].prev = pPVar9;
  return;
}

Assistant:

void CLUFactor<R>::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactor<R>::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}